

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GaussianPlumeRecord.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::GaussianPlumeRecord::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,GaussianPlumeRecord *this)

{
  ostream *poVar1;
  KString local_270;
  KString local_250;
  KString local_230;
  KString local_210;
  KString local_1f0;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  GaussianPlumeRecord *local_18;
  GaussianPlumeRecord *this_local;
  
  local_18 = this;
  this_local = (GaussianPlumeRecord *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  EnvironmentRecord::GetAsString_abi_cxx11_(&local_1c0,&this->super_EnvironmentRecord);
  poVar1 = std::operator<<(local_190,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"\tLocation:                     ");
  WorldCoordinates::GetAsString_abi_cxx11_(&local_1f0,&this->m_SrcLocation);
  poVar1 = std::operator<<(poVar1,(string *)&local_1f0);
  poVar1 = std::operator<<(poVar1,"\tOrientation:                  ");
  EulerAngles::GetAsString_abi_cxx11_(&local_210,&this->m_Ori);
  poVar1 = std::operator<<(poVar1,(string *)&local_210);
  poVar1 = std::operator<<(poVar1,"\tPlume Length, Width, Height:  ");
  Vector::GetAsString_abi_cxx11_(&local_230,&this->m_PlumeLWH);
  poVar1 = std::operator<<(poVar1,(string *)&local_230);
  poVar1 = std::operator<<(poVar1,"\td/dt:                         ");
  Vector::GetAsString_abi_cxx11_(&local_250,&this->m_DDTLEH);
  poVar1 = std::operator<<(poVar1,(string *)&local_250);
  poVar1 = std::operator<<(poVar1,"\tLeading Edge Centroid Height: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32LdEdgeCenHght);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tLeading Edge Velocity:        ");
  Vector::GetAsString_abi_cxx11_(&local_270,&this->m_LdEdgeVel);
  std::operator<<(poVar1,(string *)&local_270);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString GaussianPlumeRecord::GetAsString() const
{
    KStringStream ss;

    ss << EnvironmentRecord::GetAsString()
       << "\tLocation:                     " << m_SrcLocation.GetAsString()
       << "\tOrientation:                  " << m_Ori.GetAsString()
       << "\tPlume Length, Width, Height:  " << m_PlumeLWH.GetAsString()
       << "\td/dt:                         " << m_DDTLEH.GetAsString()
       << "\tLeading Edge Centroid Height: " << m_f32LdEdgeCenHght << "\n"
       << "\tLeading Edge Velocity:        " << m_LdEdgeVel.GetAsString();

    return ss.str();
}